

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Instructions.h
# Opt level: O2

void __thiscall flow::AllocaInstr::~AllocaInstr(AllocaInstr *this)

{
  Instr::~Instr(&this->super_Instr);
  operator_delete(this,0x68);
  return;
}

Assistant:

static LiteralType computeType(LiteralType elementType, Value* size) {  // {{{
    if (auto n = dynamic_cast<ConstantInt*>(size)) {
      if (n->get() == 1) return elementType;
    }

    switch (elementType) {
      case LiteralType::Number:
        return LiteralType::IntArray;
      case LiteralType::String:
        return LiteralType::StringArray;
      default:
        return LiteralType::Void;
    }
  }